

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O3

float Search::action_hamming_loss(action a,action *A,size_t sz)

{
  size_t sVar1;
  float fVar2;
  
  fVar2 = 0.0;
  if (sz != 0) {
    sVar1 = 0;
    do {
      if (A[sVar1] == a) {
        return 0.0;
      }
      sVar1 = sVar1 + 1;
    } while (sz != sVar1);
    fVar2 = 1.0;
  }
  return fVar2;
}

Assistant:

float action_hamming_loss(action a, const action* A, size_t sz)
{
  if (sz == 0)
    return 0.;  // latent variables have zero loss
  for (size_t i = 0; i < sz; i++)
    if (a == A[i])
      return 0.;
  return 1.;
}